

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case.c
# Opt level: O0

int32 strncmp_nocase(char *str1,char *str2,size_t len)

{
  char cVar1;
  char cVar2;
  ulong local_38;
  size_t n;
  char c2;
  char c1;
  size_t len_local;
  char *str2_local;
  char *str1_local;
  
  if ((str1 == (char *)0x0) || (str2 == (char *)0x0)) {
    str1_local._4_4_ = 1;
    if (str1 == (char *)0x0) {
      str1_local._4_4_ = -1;
    }
  }
  else {
    len_local = (size_t)str2;
    str2_local = str1;
    for (local_38 = 0; local_38 < len; local_38 = local_38 + 1) {
      cVar1 = *str2_local;
      if (('`' < cVar1) && (cVar1 < '{')) {
        cVar1 = cVar1 + -0x20;
      }
      cVar2 = *(char *)len_local;
      if (('`' < cVar2) && (cVar2 < '{')) {
        cVar2 = cVar2 + -0x20;
      }
      if (cVar1 != cVar2) {
        return (int)cVar1 - (int)cVar2;
      }
      if (cVar1 == '\0') {
        return 0;
      }
      len_local = len_local + 1;
      str2_local = str2_local + 1;
    }
    str1_local._4_4_ = 0;
  }
  return str1_local._4_4_;
}

Assistant:

int32
strncmp_nocase(const char *str1, const char *str2, size_t len)
{
    char c1, c2;

    if (str1 && str2) {
        size_t n;

        for (n = 0; n < len; ++n) {
            c1 = *(str1++);
            c1 = UPPER_CASE(c1);
            c2 = *(str2++);
            c2 = UPPER_CASE(c2);
            if (c1 != c2)
                return (c1 - c2);
            if (c1 == '\0')
                return 0;
        }
    }
    else
        return (str1 == NULL) ? -1 : 1;

    return 0;
}